

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O2

Node * __thiscall FBX::Decoder::readFile(Node *__return_storage_ptr__,Decoder *this)

{
  size_t sVar1;
  bool bVar2;
  invalid_argument *this_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  vector<FBX::Node,_std::allocator<FBX::Node>_> nodes;
  Node node;
  
  sVar1 = (this->stream).cursor;
  __y._M_str = (this->stream).data + sVar1;
  (this->stream).cursor = sVar1 + 0x17;
  __x._M_str = "Kaydara FBX Binary  ";
  __x._M_len = 0x17;
  __y._M_len = 0x17;
  bVar2 = std::operator!=(__x,__y);
  if (!bVar2) {
    initVersion(this);
    nodes.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    nodes.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    nodes.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    while( true ) {
      Node::Node(&node);
      bVar2 = readNode(this,&node);
      if (!bVar2) break;
      std::vector<FBX::Node,_std::allocator<FBX::Node>_>::push_back(&nodes,&node);
      Node::~Node(&node);
    }
    Node::~Node(&node);
    Node::Node(__return_storage_ptr__);
    std::vector<FBX::Node,_std::allocator<FBX::Node>_>::operator=
              (&__return_storage_ptr__->children,&nodes);
    std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&nodes);
    return __return_storage_ptr__;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&node,
                 "Invalid header, file is not an FBX binary file ",&this->path);
  std::invalid_argument::invalid_argument(this_00,(string *)&node);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Node Decoder::readFile() {
        auto FBX_HEADER = "Kaydara FBX Binary  \x00\x1a\x00"sv;
        auto temp = stream.read<char>(FBX_HEADER.size());
        if (FBX_HEADER != std::string_view(temp.begin, FBX_HEADER.size()))
            throw std::invalid_argument("Invalid header, file is not an FBX binary file " + path);

        initVersion();

        std::vector<Node> nodes;
        while (true) {
            Node node;
            if (!readNode(node))
                break;
            nodes.push_back(node);
        }

        Node root;
        root.children = nodes;

        return root;
    }